

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_features.c
# Opt level: O0

int mbedtls_version_check_feature(char *feature)

{
  int iVar1;
  char **local_20;
  char **idx;
  char *feature_local;
  
  local_20 = features;
  if (feature != (char *)0x0) {
    for (; *local_20 != (char *)0x0; local_20 = local_20 + 1) {
      iVar1 = strcmp(*local_20,feature);
      if (iVar1 == 0) {
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int mbedtls_version_check_feature( const char *feature )
{
    const char * const *idx = features;

    if( *idx == NULL )
        return( -2 );

    if( feature == NULL )
        return( -1 );

    while( *idx != NULL )
    {
        if( !strcmp( *idx, feature ) )
            return( 0 );
        idx++;
    }
    return( -1 );
}